

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

void __thiscall QtPrivate::QCalToolButton::paintEvent(QCalToolButton *this,QPaintEvent *e)

{
  QFlagsStorage<QStyle::StateFlag> QVar1;
  Int IVar2;
  QPalette *pQVar3;
  QPalette *in_RDI;
  long in_FS_OFFSET;
  QPalette toolPalette;
  QStyleOptionToolButton opt;
  ColorRole cr;
  uint7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  undefined1 uVar4;
  QPalette *palette;
  undefined4 in_stack_ffffffffffffff38;
  undefined1 local_c0 [16];
  QPaintEvent *in_stack_ffffffffffffff50;
  QToolButton *in_stack_ffffffffffffff58;
  undefined1 local_a0 [152];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  palette = in_RDI;
  memset(local_a0,0xaa,0x98);
  QStyleOptionToolButton::QStyleOptionToolButton((QStyleOptionToolButton *)0x52592d);
  (**(code **)(in_RDI->d + 0x1b8))(in_RDI,local_a0);
  cr = (ColorRole)((ulong)in_RDI >> 0x20);
  QVar1.i = (Int)QFlags<QStyle::StateFlag>::operator&
                           ((QFlags<QStyle::StateFlag> *)
                            CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),cr);
  IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xffffffffffffff3c);
  uVar4 = true;
  if (IVar2 == 0) {
    uVar4 = QAbstractButton::isDown((QAbstractButton *)CONCAT17(1,in_stack_ffffffffffffff20));
  }
  if ((bool)uVar4 == false) {
    local_c0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_c0._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar3 = QWidget::palette((QWidget *)(ulong)in_stack_ffffffffffffff20);
    QPalette::QPalette((QPalette *)local_c0,(QPalette *)pQVar3);
    QPalette::color((QPalette *)CONCAT17(uVar4,in_stack_ffffffffffffff20),cr);
    QPalette::setColor((QPalette *)CONCAT17(uVar4,in_stack_ffffffffffffff20),cr,(QColor *)0x5259f7);
    QWidget::setPalette((QWidget *)CONCAT44(QVar1.i,in_stack_ffffffffffffff38),palette);
    QPalette::~QPalette((QPalette *)local_c0);
  }
  else {
    QPalette::QPalette((QPalette *)&stack0xffffffffffffff50);
    QWidget::setPalette((QWidget *)CONCAT44(QVar1.i,in_stack_ffffffffffffff38),palette);
    QPalette::~QPalette((QPalette *)&stack0xffffffffffffff50);
  }
  QToolButton::paintEvent(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  QStyleOptionToolButton::~QStyleOptionToolButton
            ((QStyleOptionToolButton *)CONCAT17(uVar4,in_stack_ffffffffffffff20));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void paintEvent(QPaintEvent *e) override
    {
        Q_UNUSED(e);

        QStyleOptionToolButton opt;
        initStyleOption(&opt);

        if (opt.state & QStyle::State_MouseOver || isDown()) {
            //act as normal button
            setPalette(QPalette());
        } else {
            //set the highlight color for button text
            QPalette toolPalette = palette();
            toolPalette.setColor(QPalette::ButtonText, toolPalette.color(QPalette::HighlightedText));
            setPalette(toolPalette);
        }

        QToolButton::paintEvent(e);
    }